

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

Arg * __thiscall
fmt::internal::PrintfFormatter<char>::get_arg(PrintfFormatter<char> *this,char *s,uint arg_index)

{
  undefined8 uVar1;
  int in_ECX;
  char *in_RDX;
  FormatterBase *in_RSI;
  Arg *in_RDI;
  char *error;
  FormatError *in_stack_ffffffffffffff98;
  CStringRef message;
  char **in_stack_ffffffffffffffa8;
  BasicCStringRef<char> local_28;
  char *local_20;
  char *local_10;
  
  local_20 = (char *)0x0;
  local_10 = in_RDX;
  if (in_ECX == -1) {
    FormatterBase::next_arg((FormatterBase *)in_RDI,in_stack_ffffffffffffffa8);
  }
  else {
    FormatterBase::get_arg(in_RSI,(uint)((ulong)in_RDI >> 0x20),(char **)in_RDI);
  }
  if (local_20 == (char *)0x0) {
    return in_RDI;
  }
  uVar1 = __cxa_allocate_exception(0x10);
  message.data_ = local_20;
  if (*local_10 == '\0') {
    message.data_ = "invalid format string";
  }
  BasicCStringRef<char>::BasicCStringRef(&local_28,message.data_);
  FormatError::FormatError(in_stack_ffffffffffffff98,message);
  __cxa_throw(uVar1,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

Arg fmt::internal::PrintfFormatter<Char>::get_arg(
    const Char *s, unsigned arg_index) {
  (void)s;
  const char *error = 0;
  Arg arg = arg_index == UINT_MAX ?
    next_arg(error) : FormatterBase::get_arg(arg_index - 1, error);
  if (error)
    FMT_THROW(FormatError(!*s ? "invalid format string" : error));
  return arg;
}